

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_FDTD_1D.cpp
# Opt level: O1

bool __thiscall PP_FDTD_1D::run(PP_FDTD_1D *this,bool shortCircuit,bool borderExcitationON)

{
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  unsigned_long uVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  calculateCoefficients(this);
  (*this->_vptr_PP_FDTD_1D[2])();
  if (1 < this->Nt) {
    uVar8 = 1;
    do {
      uVar1 = this->Nz;
      if (1 < uVar1) {
        pdVar5 = this->V[uVar8 - 1];
        pdVar2 = this->I[uVar8 - 1];
        pdVar3 = this->I[uVar8];
        uVar6 = 1;
        do {
          pdVar3[uVar6] = (pdVar5[uVar6] - pdVar5[uVar6 - 1]) * this->c1 + this->c2 * pdVar2[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      if (shortCircuit) {
        *this->I[uVar8] = this->I[uVar8][1];
      }
      else {
        *this->I[uVar8] = 0.0;
      }
      if (borderExcitationON) {
        (*this->_vptr_PP_FDTD_1D[3])(this,uVar8);
        uVar4 = this->Nz;
        if (1 < uVar4 - 1) {
          pdVar5 = this->I[uVar8];
          pdVar2 = this->V[uVar8 - 1];
          pdVar3 = this->V[uVar8];
          lVar7 = 0;
          do {
            pdVar3[lVar7 + 1] =
                 (pdVar5[lVar7 + 2] - pdVar5[lVar7 + 1]) * this->c3 + this->c4 * pdVar2[lVar7 + 1];
            lVar7 = lVar7 + 1;
          } while (uVar4 - 2 != lVar7);
        }
      }
      else if (uVar1 != 1) {
        pdVar5 = this->I[uVar8];
        pdVar2 = this->V[uVar8 - 1];
        pdVar3 = this->V[uVar8];
        lVar7 = 0;
        do {
          pdVar3[lVar7] = (pdVar5[lVar7 + 1] - pdVar5[lVar7]) * this->c3 + this->c4 * pdVar2[lVar7];
          lVar7 = lVar7 + 1;
        } while (uVar1 - 1 != lVar7);
      }
      if (shortCircuit) {
        pdVar5 = this->V[uVar8];
        dVar9 = 0.0;
      }
      else {
        pdVar5 = this->V[uVar8];
        dVar9 = pdVar5[this->Nz - 2];
      }
      pdVar5[this->Nz - 1] = dVar9;
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->Nt);
  }
  return true;
}

Assistant:

bool PP_FDTD_1D::run(bool shortCircuit, bool borderExcitationON)
{
    //determine the coefficient of numerical iteration equations
    calculateCoefficients();

    //at t=0 initialize the whole space
    intialState();

    //iterations
    for(unsigned long n=1 ; n<Nt ; n++) //loop over time
    {
        //determine the next current over the whole space
        for(unsigned long k=1 ; k<Nz ; k++) //loop over space : may be multithread
        {
            //I[n][k] stands for i(k*dz, (n+0.5)*dt)
            //V[n][k] stands for v((k+0.5)*dz, n*dt)
            I[n][k] = c1*(V[n-1][k]-V[n-1][k-1]) + c2*I[n-1][k];

        }
        //border conditions for current: on the left because it is the state that cannot be calculated (correct me if I am wrong)
        if(shortCircuit)
        {
            I[n][0] = I[n][1];
        }
        else
        {
            I[n][0] = 0.0;
        }

        //deternmine the next voltage state
        if(borderExcitationON) //if we apply an excitation (input voltage)
        {
            borderExcitation(n);
            for(unsigned long k=1 ; k<(Nz-1) ; k++)
            {
                V[n][k] = c3*(I[n][k+1]-I[n][k]) + c4*V[n-1][k];
            }
        }
        else
        {
            for(unsigned long k=0 ; k<(Nz-1) ; k++)
            {
                V[n][k] = c3*(I[n][k+1]-I[n][k]) + c4*V[n-1][k];
            }
        }
        //boundary conditions on voltage: either 0 to simulate a short circuit or a miror condition for an open circuit
        if(shortCircuit)
        {
            V[n][Nz-1] = 0.0;
        }
        else
        {
            V[n][Nz-1] = V[n][Nz-2];
        }

    }

    return true;
}